

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arguments.cpp
# Opt level: O3

bool ArgumentsParse(int argc,char **argv,Arguments *args)

{
  int iVar1;
  uint32_t uVar2;
  Arguments *pAVar3;
  char *pcVar4;
  char *pcVar5;
  getopt_context_t ctx;
  getopt_context_t local_60;
  
  iVar1 = getopt_create_context(&local_60,argc,argv,option_list);
  if (iVar1 < 0) {
    printf("error while creating getopt ctx, bad options-list?");
    return false;
  }
switchD_0013648b_caseD_0:
  while (iVar1 = getopt_next(&local_60), pcVar4 = local_60.current_opt_arg, 0x20 < iVar1) {
    if (iVar1 == 0x21) {
      pcVar4 = "live-glsl: invalid use of flag %s\n";
      goto LAB_00136563;
    }
    if (iVar1 == 0x3f) {
      pcVar4 = "live-glsl: unknown flag %s\n";
      goto LAB_00136563;
    }
    if (iVar1 == 0x2b) {
      pcVar4 = "live-glsl: got argument without flag: %s\n";
LAB_00136563:
      printf(pcVar4,local_60.current_opt_arg);
      return false;
    }
  }
  switch(iVar1) {
  default:
    goto switchD_0013648b_caseD_0;
  case 1:
    pcVar5 = (char *)(args->Input)._M_string_length;
    strlen(local_60.current_opt_arg);
    pAVar3 = args;
    break;
  case 2:
    pcVar5 = (char *)(args->Output)._M_string_length;
    strlen(local_60.current_opt_arg);
    pAVar3 = (Arguments *)&args->Output;
    break;
  case 3:
    uVar2 = atoi(local_60.current_opt_arg);
    args->Width = uVar2;
    goto switchD_0013648b_caseD_0;
  case 4:
    uVar2 = atoi(local_60.current_opt_arg);
    args->Height = uVar2;
    goto switchD_0013648b_caseD_0;
  case 5:
    iVar1 = atoi(local_60.current_opt_arg);
    args->EnableIni = iVar1 != 0;
    goto switchD_0013648b_caseD_0;
  case -1:
    if ((args->Input)._M_string_length != 0) {
      return true;
    }
    puts("live-glsl: no input file (--input [path])");
    return false;
  }
  std::__cxx11::string::_M_replace((ulong)pAVar3,0,pcVar5,(ulong)pcVar4);
  goto switchD_0013648b_caseD_0;
}

Assistant:

bool ArgumentsParse(int argc, const char** argv, Arguments& args) {
    getopt_context_t ctx;
    if (getopt_create_context(&ctx, argc, argv, option_list) < 0) {
        printf( "error while creating getopt ctx, bad options-list?" );
        return false;
    }

    int opt = 0;
    while ((opt = getopt_next(&ctx)) != -1) {
        switch (opt) {
            case '+':
                printf("live-glsl: got argument without flag: %s\n", ctx.current_opt_arg);
                return false;
            case '?':
                printf("live-glsl: unknown flag %s\n", ctx.current_opt_arg);
                return false;
            case '!':
                printf("live-glsl: invalid use of flag %s\n", ctx.current_opt_arg);
                return false;
            case OPTION_INPUT:
                args.Input = ctx.current_opt_arg;
                break;
            case OPTION_OUTPUT:
                args.Output = ctx.current_opt_arg;
                break;
            case OPTION_WIDTH:
                args.Width = atoi(ctx.current_opt_arg);
                break;
            case OPTION_HEIGHT:
                args.Height = atoi(ctx.current_opt_arg);
                break;
            case OPTION_INI:
                args.EnableIni = (bool)atoi(ctx.current_opt_arg);
                break;
            default:
                break;
        }
    }
    if (args.Input.empty()) {
        printf("live-glsl: no input file (--input [path])\n");
        return false;
    }
    return true;
}